

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Biquad.cpp
# Opt level: O1

void __thiscall Iir::Biquad::setOnePole(Biquad *this,complex_t pole,complex_t zero)

{
  invalid_argument *this_00;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  undefined4 in_XMM3_Da;
  undefined4 in_XMM3_Db;
  
  if ((in_XMM1_Qa != 0.0) || (NAN(in_XMM1_Qa))) {
    this_00 = (invalid_argument *)
              __cxa_allocate_exception
                        (0x10,pole._M_value._0_8_,pole._M_value._8_8_,zero._M_value._0_8_,
                         zero._M_value._8_8_);
    std::invalid_argument::invalid_argument(this_00,"Imaginary part of pole is non-zero.");
  }
  else {
    if (((double)CONCAT44(in_XMM3_Db,in_XMM3_Da) == 0.0) &&
       (!NAN((double)CONCAT44(in_XMM3_Db,in_XMM3_Da)))) {
      setCoefficients(this,1.0,-in_XMM0_Qa,0.0,1.0,-in_XMM2_Qa,0.0);
      return;
    }
    this_00 = (invalid_argument *)
              __cxa_allocate_exception
                        (0x10,pole._M_value._0_8_,pole._M_value._8_8_,zero._M_value._0_8_,
                         zero._M_value._8_8_);
    std::invalid_argument::invalid_argument(this_00,"Imaginary part of zero is non-zero.");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void Biquad::setOnePole (complex_t pole, complex_t zero)
	{
		if (pole.imag() != 0) throw_invalid_argument("Imaginary part of pole is non-zero.");
		if (zero.imag() != 0) throw_invalid_argument("Imaginary part of zero is non-zero.");

		const double a0 = 1;
		const double a1 = -pole.real();
		const double a2 = 0;
		const double b0 = 1;
		const double b1 = -zero.real();
		const double b2 = 0;

		setCoefficients (a0, a1, a2, b0, b1, b2);
	}